

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O3

int libssh2_publickey_list_fetch
              (LIBSSH2_PUBLICKEY *pkey,unsigned_long *num_keys,libssh2_publickey_list **pkey_list)

{
  uchar **data;
  size_t *data_len;
  uchar **pdata;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ssize_t sVar4;
  libssh2_publickey_list *plVar5;
  libssh2_publickey_attribute *plVar6;
  uchar *puVar7;
  char *pcVar8;
  size_t sVar9;
  uchar *puVar10;
  uchar *puVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  libssh2_publickey_list *local_70;
  ulong local_50;
  
  if (pkey == (LIBSSH2_PUBLICKEY *)0x0) {
    return -0x27;
  }
  channel = pkey->channel;
  session = channel->session;
  if (pkey->listFetch_state == libssh2_NB_state_idle) {
    pkey->listFetch_data = (uchar *)0x0;
    pkey->listFetch_s = pkey->listFetch_buffer;
    _libssh2_htonu32(pkey->listFetch_buffer,8);
    puVar7 = pkey->listFetch_s;
    pkey->listFetch_s = puVar7 + 4;
    _libssh2_htonu32(puVar7 + 4,4);
    puVar7 = pkey->listFetch_s;
    pkey->listFetch_s = puVar7 + 4;
    builtin_memcpy(puVar7 + 4,"list",4);
    puVar7 = pkey->listFetch_s + 4;
    pkey->listFetch_s = puVar7;
    pkey->listFetch_state = libssh2_NB_state_created;
  }
  else {
    if (pkey->listFetch_state != libssh2_NB_state_created) goto LAB_00120b5e;
    puVar7 = pkey->listFetch_s;
  }
  puVar10 = pkey->listFetch_buffer;
  sVar4 = _libssh2_channel_write(channel,0,puVar10,(long)puVar7 - (long)puVar10);
  if (sVar4 == -0x25) {
    return -0x25;
  }
  if ((long)pkey->listFetch_s - (long)puVar10 != sVar4) {
    pkey->listFetch_state = libssh2_NB_state_idle;
    iVar1 = _libssh2_error(session,-7,"Unable to send publickey list packet");
    return iVar1;
  }
  pkey->listFetch_state = libssh2_NB_state_sent;
LAB_00120b5e:
  data = &pkey->listFetch_data;
  data_len = &pkey->listFetch_data_len;
  pdata = &pkey->listFetch_s;
  local_50 = 0;
  local_70 = (libssh2_publickey_list *)0x0;
  uVar12 = 0;
  do {
    iVar1 = publickey_packet_receive(pkey,data,data_len);
    if (iVar1 != 0) {
      if (iVar1 != -0x25) {
        pcVar8 = "Timeout waiting for response from publickey subsystem";
        iVar1 = -0x1e;
LAB_00121118:
        _libssh2_error(session,iVar1,pcVar8);
LAB_00121125:
        if (*data != (uchar *)0x0) {
          (*session->free)(*data,&session->abstract);
          *data = (uchar *)0x0;
        }
        if (local_70 != (libssh2_publickey_list *)0x0) {
          libssh2_publickey_list_free(pkey,local_70);
        }
        pkey->listFetch_state = libssh2_NB_state_idle;
        iVar1 = -1;
      }
      return iVar1;
    }
    *pdata = *data;
    iVar1 = publickey_response_id(pdata,*data_len);
    if (iVar1 < 0) {
      pcVar8 = "Invalid publickey subsystem response code";
      iVar1 = -0x24;
      goto LAB_00121118;
    }
    if (iVar1 == 2) {
      if (uVar12 < local_50) {
LAB_00120c54:
        puVar7 = pkey->listFetch_s;
        if (pkey->version == 1) {
          if (puVar7 + 4 <= pkey->listFetch_data + pkey->listFetch_data_len) {
            uVar2 = _libssh2_ntohu32(puVar7);
            puVar7 = *pdata + 4;
            *pdata = puVar7;
            if (uVar2 == 0) {
              local_70[uVar12].num_attrs = 0;
              local_70[uVar12].attrs = (libssh2_publickey_attribute *)0x0;
            }
            else {
              local_70[uVar12].num_attrs = 1;
              plVar6 = (libssh2_publickey_attribute *)(*session->alloc)(0x28,&session->abstract);
              local_70[uVar12].attrs = plVar6;
              if (plVar6 == (libssh2_publickey_attribute *)0x0) {
                pcVar8 = "Unable to allocate memory for publickey attributes";
                iVar1 = -6;
LAB_0012101a:
                _libssh2_error(session,iVar1,pcVar8);
                goto LAB_00121125;
              }
              plVar6->name = "comment";
              plVar6->name_len = 7;
              puVar7 = *pdata;
              plVar6->value = (char *)puVar7;
              plVar6->value_len = (ulong)uVar2;
              plVar6->mandatory = '\0';
              puVar7 = puVar7 + uVar2;
              *pdata = puVar7;
            }
            if (puVar7 + 4 <= *data + *data_len) {
              uVar2 = _libssh2_ntohu32(puVar7);
              uVar13 = (ulong)uVar2;
              local_70[uVar12].name_len = uVar13;
              puVar7 = *pdata;
              *pdata = puVar7 + 4;
              puVar11 = puVar7 + uVar13 + 4;
              puVar10 = *data;
              sVar9 = *data_len;
              if (puVar10 + sVar9 < puVar11) goto LAB_0012118c;
              local_70[uVar12].name = puVar7 + 4;
              *pdata = puVar11;
              if (puVar7 + uVar13 + 8 <= puVar10 + sVar9) {
                uVar2 = _libssh2_ntohu32(puVar11);
                local_70[uVar12].blob_len = (ulong)uVar2;
                puVar11 = *pdata;
                puVar10 = puVar11 + 4;
                *pdata = puVar10;
                puVar11 = puVar11 + (ulong)uVar2 + 4;
                puVar7 = *data;
                if (puVar11 <= puVar7 + *data_len) {
                  local_70[uVar12].blob = puVar10;
                  *pdata = puVar11;
                  goto LAB_00120f8c;
                }
              }
            }
          }
LAB_00121057:
          pcVar8 = "ListFetch data too short";
          iVar1 = -0x26;
        }
        else {
          if (pkey->listFetch_data + pkey->listFetch_data_len < puVar7 + 4) goto LAB_00121057;
          uVar2 = _libssh2_ntohu32(puVar7);
          uVar13 = (ulong)uVar2;
          local_70[uVar12].name_len = uVar13;
          puVar7 = *pdata;
          *pdata = puVar7 + 4;
          puVar11 = puVar7 + uVar13 + 4;
          puVar10 = *data;
          sVar9 = *data_len;
          if (puVar10 + sVar9 < puVar11) {
LAB_0012118c:
            pcVar8 = "ListFetch data too short";
            iVar1 = -0x26;
            goto LAB_00121197;
          }
          local_70[uVar12].name = puVar7 + 4;
          *pdata = puVar11;
          if (puVar10 + sVar9 < puVar7 + uVar13 + 8) goto LAB_00121057;
          uVar2 = _libssh2_ntohu32(puVar11);
          uVar13 = (ulong)uVar2;
          local_70[uVar12].blob_len = uVar13;
          puVar7 = *pdata;
          *pdata = puVar7 + 4;
          puVar11 = puVar7 + uVar13 + 4;
          puVar10 = *data;
          sVar9 = *data_len;
          if (puVar10 + sVar9 < puVar11) goto LAB_00121057;
          local_70[uVar12].blob = puVar7 + 4;
          *pdata = puVar11;
          if (puVar10 + sVar9 < puVar7 + uVar13 + 8) goto LAB_00121057;
          uVar2 = _libssh2_ntohu32(puVar11);
          local_70[uVar12].num_attrs = (ulong)uVar2;
          *pdata = *pdata + 4;
          if (uVar2 == 0) {
            local_70[uVar12].attrs = (libssh2_publickey_attribute *)0x0;
            puVar7 = *data;
LAB_00120f8c:
            local_70[uVar12].packet = puVar7;
            uVar13 = uVar12 + 1;
            local_70[uVar12 + 1].packet = (uchar *)0x0;
            goto LAB_00120fb4;
          }
          plVar6 = (libssh2_publickey_attribute *)
                   (*session->alloc)((ulong)uVar2 * 0x28,&session->abstract);
          local_70[uVar12].attrs = plVar6;
          if (plVar6 != (libssh2_publickey_attribute *)0x0) {
            puVar7 = *data;
            if (local_70[uVar12].num_attrs != 0) {
              puVar10 = *pdata;
              sVar9 = *data_len;
              lVar14 = 0;
              uVar13 = 0;
              do {
                if (puVar7 + sVar9 < puVar10 + 4) {
LAB_00121006:
                  pcVar8 = "ListFetch data too short";
                  iVar1 = -0x26;
                  goto LAB_0012101a;
                }
                uVar2 = _libssh2_ntohu32(puVar10);
                plVar6 = local_70[uVar12].attrs;
                *(ulong *)((long)&plVar6->name_len + lVar14) = (ulong)uVar2;
                puVar10 = *pdata;
                puVar7 = puVar10 + 4;
                *pdata = puVar7;
                puVar10 = puVar10 + (ulong)uVar2 + 4;
                puVar11 = *data;
                sVar9 = *data_len;
                if (puVar11 + sVar9 < puVar10) goto LAB_00121006;
                *(uchar **)((long)&plVar6->name + lVar14) = puVar7;
                *pdata = puVar10;
                if (puVar11 + sVar9 < puVar10 + 4) goto LAB_00121006;
                uVar2 = _libssh2_ntohu32(puVar10);
                plVar6 = local_70[uVar12].attrs;
                *(ulong *)((long)&plVar6->value_len + lVar14) = (ulong)uVar2;
                puVar10 = *pdata;
                puVar11 = puVar10 + 4;
                *pdata = puVar11;
                puVar10 = puVar10 + (ulong)uVar2 + 4;
                puVar7 = *data;
                sVar9 = *data_len;
                if (puVar7 + sVar9 < puVar10) goto LAB_00121006;
                *(uchar **)((long)&plVar6->value + lVar14) = puVar11;
                *pdata = puVar10;
                (&plVar6->mandatory)[lVar14] = '\0';
                uVar13 = uVar13 + 1;
                lVar14 = lVar14 + 0x28;
              } while (uVar13 < local_70[uVar12].num_attrs);
            }
            goto LAB_00120f8c;
          }
          pcVar8 = "Unable to allocate memory for publickey attributes";
          iVar1 = -6;
        }
        _libssh2_error(session,iVar1,pcVar8);
      }
      else {
        sVar9 = local_50 * 0x38 + 0x1f8;
        if (local_70 == (libssh2_publickey_list *)0x0) {
          plVar5 = (libssh2_publickey_list *)(*session->alloc)(sVar9,&session->abstract);
        }
        else {
          plVar5 = (libssh2_publickey_list *)(*session->realloc)(local_70,sVar9,&session->abstract);
        }
        if (plVar5 != (libssh2_publickey_list *)0x0) {
          local_50 = local_50 + 8;
          local_70 = plVar5;
          goto LAB_00120c54;
        }
        pcVar8 = "Unable to allocate memory for publickey list";
        iVar1 = -6;
LAB_00121197:
        _libssh2_error(session,iVar1,pcVar8);
      }
      goto LAB_00121125;
    }
    if (iVar1 == 0) {
      if (*pdata + 8 <= *data + *data_len) {
        uVar2 = _libssh2_ntohu32(*pdata);
        puVar7 = *pdata;
        *pdata = puVar7 + 4;
        uVar3 = _libssh2_ntohu32(puVar7 + 4);
        puVar7 = *pdata;
        *pdata = puVar7 + 4;
        if (puVar7 + (ulong)uVar3 + 8 <= *data + *data_len) {
          *pdata = puVar7 + (ulong)uVar3 + 4;
          uVar3 = _libssh2_ntohu32(puVar7 + (ulong)uVar3 + 4);
          puVar7 = *pdata;
          *pdata = puVar7 + 4;
          puVar7 = puVar7 + (ulong)uVar3 + 4;
          if (puVar7 <= *data + *data_len) {
            *pdata = puVar7;
            if ((ulong)uVar2 == 0) {
              (*session->free)(*data,&session->abstract);
              pkey->listFetch_data = (uchar *)0x0;
              *pkey_list = local_70;
              *num_keys = uVar12;
              pkey->listFetch_state = libssh2_NB_state_idle;
              return 0;
            }
            publickey_status_error(pkey,session,(ulong)uVar2);
            goto LAB_00121125;
          }
        }
      }
      pcVar8 = "ListFetch data too short";
      iVar1 = -0x26;
      goto LAB_00121118;
    }
    _libssh2_error(session,-0x24,"Unexpected publickey subsystem response");
    (*session->free)(*data,&session->abstract);
    uVar13 = uVar12;
LAB_00120fb4:
    *data = (uchar *)0x0;
    uVar12 = uVar13;
  } while( true );
}

Assistant:

LIBSSH2_API int
libssh2_publickey_list_fetch(LIBSSH2_PUBLICKEY * pkey, unsigned long *num_keys,
                             libssh2_publickey_list ** pkey_list)
{
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_SESSION *session;
    libssh2_publickey_list *list = NULL;
    unsigned long buffer_len = 12, keys = 0, max_keys = 0, i;
    /* 12 = packet_len(4) + list_len(4) + "list"(4) */
    int response;
    int rc;

    if(!pkey)
        return LIBSSH2_ERROR_BAD_USE;

    channel = pkey->channel;
    session = channel->session;

    if(pkey->listFetch_state == libssh2_NB_state_idle) {
        pkey->listFetch_data = NULL;

        pkey->listFetch_s = pkey->listFetch_buffer;
        _libssh2_htonu32(pkey->listFetch_s, (uint32_t)(buffer_len - 4));
        pkey->listFetch_s += 4;
        _libssh2_htonu32(pkey->listFetch_s, sizeof("list") - 1);
        pkey->listFetch_s += 4;
        memcpy(pkey->listFetch_s, "list", sizeof("list") - 1);
        pkey->listFetch_s += sizeof("list") - 1;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey \"list\" packet"));

        pkey->listFetch_state = libssh2_NB_state_created;
    }

    if(pkey->listFetch_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0,
                                          pkey->listFetch_buffer,
                                          (pkey->listFetch_s -
                                           pkey->listFetch_buffer));
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((pkey->listFetch_s - pkey->listFetch_buffer) != nwritten) {
            pkey->listFetch_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send publickey list packet");
        }

        pkey->listFetch_state = libssh2_NB_state_sent;
    }

    for(;;) {
        rc = publickey_packet_receive(pkey, &pkey->listFetch_data,
                                      &pkey->listFetch_data_len);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            _libssh2_error(session, LIBSSH2_ERROR_SOCKET_TIMEOUT,
                           "Timeout waiting for response from "
                           "publickey subsystem");
            goto err_exit;
        }

        pkey->listFetch_s = pkey->listFetch_data;
        if((response =
             publickey_response_id(&pkey->listFetch_s,
                                   pkey->listFetch_data_len)) < 0) {
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Invalid publickey subsystem response code");
            goto err_exit;
        }

        switch(response) {
        case LIBSSH2_PUBLICKEY_RESPONSE_STATUS:
            /* Error, or processing complete */
        {
            unsigned long status, descr_len, lang_len;

            if(pkey->listFetch_s + 8 <=
               pkey->listFetch_data + pkey->listFetch_data_len) {
                status = _libssh2_ntohu32(pkey->listFetch_s);
                pkey->listFetch_s += 4;
                descr_len = _libssh2_ntohu32(pkey->listFetch_s);
                pkey->listFetch_s += 4;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "ListFetch data too short");
                goto err_exit;
            }

            if(pkey->listFetch_s + descr_len + 4 <=
               pkey->listFetch_data + pkey->listFetch_data_len) {
                /* description starts at pkey->listFetch_s */
                pkey->listFetch_s += descr_len;
                lang_len = _libssh2_ntohu32(pkey->listFetch_s);
                pkey->listFetch_s += 4;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "ListFetch data too short");
                goto err_exit;
            }

            if(pkey->listFetch_s + lang_len <=
               pkey->listFetch_data + pkey->listFetch_data_len) {
                /* lang starts at pkey->listFetch_s */
                pkey->listFetch_s += lang_len;
            }
            else {
                _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                               "ListFetch data too short");
                goto err_exit;
            }

            if(pkey->listFetch_s >
                pkey->listFetch_data + pkey->listFetch_data_len) {
                _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                               "Malformed publickey subsystem packet");
                goto err_exit;
            }

            if(status == LIBSSH2_PUBLICKEY_SUCCESS) {
                LIBSSH2_FREE(session, pkey->listFetch_data);
                pkey->listFetch_data = NULL;
                *pkey_list = list;
                *num_keys = keys;
                pkey->listFetch_state = libssh2_NB_state_idle;
                return 0;
            }

            publickey_status_error(pkey, session, status);
            goto err_exit;
        }
        case LIBSSH2_PUBLICKEY_RESPONSE_PUBLICKEY:
            /* What we want */
            if(keys >= max_keys) {
                libssh2_publickey_list *newlist;
                /* Grow the key list if necessary */
                max_keys += 8;
                newlist =
                    LIBSSH2_REALLOC(session, list,
                                    (max_keys +
                                     1) * sizeof(libssh2_publickey_list));
                if(!newlist) {
                    _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                   "Unable to allocate memory for "
                                   "publickey list");
                    goto err_exit;
                }
                list = newlist;
            }
            if(pkey->version == 1) {
                unsigned long comment_len;

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    comment_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(comment_len) {
                    list[keys].num_attrs = 1;
                    list[keys].attrs =
                        LIBSSH2_ALLOC(session,
                                      sizeof(libssh2_publickey_attribute));
                    if(!list[keys].attrs) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate memory for "
                                       "publickey attributes");
                        goto err_exit;
                    }
                    list[keys].attrs[0].name = "comment";
                    list[keys].attrs[0].name_len = sizeof("comment") - 1;
                    list[keys].attrs[0].value = (char *) pkey->listFetch_s;
                    list[keys].attrs[0].value_len = comment_len;
                    list[keys].attrs[0].mandatory = 0;

                    pkey->listFetch_s += comment_len;
                }
                else {
                    list[keys].num_attrs = 0;
                    list[keys].attrs = NULL;
                }

                if(pkey->listFetch_s + 4 <=
                    pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].name_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].name_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].blob_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].blob_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }
            }
            else {
                /* Version == 2 */

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].name_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].name = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].name_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob_len = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + list[keys].blob_len <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].blob = pkey->listFetch_s;
                    pkey->listFetch_s += list[keys].blob_len;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(pkey->listFetch_s + 4 <=
                   pkey->listFetch_data + pkey->listFetch_data_len) {
                    list[keys].num_attrs = _libssh2_ntohu32(pkey->listFetch_s);
                    pkey->listFetch_s += 4;
                }
                else {
                    _libssh2_error(session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                   "ListFetch data too short");
                    goto err_exit;
                }

                if(list[keys].num_attrs) {
                    list[keys].attrs =
                        LIBSSH2_ALLOC(session,
                                      list[keys].num_attrs *
                                      sizeof(libssh2_publickey_attribute));
                    if(!list[keys].attrs) {
                        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                       "Unable to allocate memory for "
                                       "publickey attributes");
                        goto err_exit;
                    }
                    for(i = 0; i < list[keys].num_attrs; i++) {
                        if(pkey->listFetch_s + 4 <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].name_len =
                                _libssh2_ntohu32(pkey->listFetch_s);
                            pkey->listFetch_s += 4;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        if(pkey->listFetch_s + list[keys].attrs[i].name_len <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].name =
                                (char *) pkey->listFetch_s;
                            pkey->listFetch_s += list[keys].attrs[i].name_len;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        if(pkey->listFetch_s + 4 <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].value_len =
                                _libssh2_ntohu32(pkey->listFetch_s);
                            pkey->listFetch_s += 4;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        if(pkey->listFetch_s +
                           list[keys].attrs[i].value_len <=
                           pkey->listFetch_data + pkey->listFetch_data_len) {
                            list[keys].attrs[i].value =
                                (char *) pkey->listFetch_s;
                            pkey->listFetch_s += list[keys].attrs[i].value_len;
                        }
                        else {
                            _libssh2_error(session,
                                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                                           "ListFetch data too short");
                            goto err_exit;
                        }

                        /* actually an ignored value */
                        list[keys].attrs[i].mandatory = 0;
                    }
                }
                else {
                    list[keys].attrs = NULL;
                }
            }
            /* To be FREEd in libssh2_publickey_list_free() */
            list[keys].packet = pkey->listFetch_data;
            keys++;

            list[keys].packet = NULL;   /* Terminate the list */
            pkey->listFetch_data = NULL;
            break;
        default:
            /* Unknown/Unexpected */
            _libssh2_error(session, LIBSSH2_ERROR_PUBLICKEY_PROTOCOL,
                           "Unexpected publickey subsystem response");
            LIBSSH2_FREE(session, pkey->listFetch_data);
            pkey->listFetch_data = NULL;
        }
    }

    /* Only reached via explicit goto */
err_exit:
    if(pkey->listFetch_data) {
        LIBSSH2_FREE(session, pkey->listFetch_data);
        pkey->listFetch_data = NULL;
    }
    if(list) {
        libssh2_publickey_list_free(pkey, list);
    }
    pkey->listFetch_state = libssh2_NB_state_idle;
    return -1;
}